

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOf_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::IsPartOf_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,IsPartOf_PDU *this)

{
  ostream *poVar1;
  KString local_270;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IsPartOf_PDU *local_18;
  IsPartOf_PDU *this_local;
  
  local_18 = this;
  this_local = (IsPartOf_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::operator<<(local_190,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"-Transfer Control Request PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Simulation_Management_Header);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  DATA_TYPE::RelationshipRecord::GetAsString_abi_cxx11_(&local_210,&this->m_RelRec);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"Location Of Part: ");
  DATA_TYPE::Vector::GetAsString_abi_cxx11_(&local_230,&this->m_LocPrt);
  poVar1 = std::operator<<(poVar1,(string *)&local_230);
  DATA_TYPE::NamedLocationIdentifier::GetAsString_abi_cxx11_(&local_250,&this->m_NmLocID);
  poVar1 = std::operator<<(poVar1,(string *)&local_250);
  poVar1 = std::operator<<(poVar1,"Part Type: ");
  DATA_TYPE::EntityType::GetAsString_abi_cxx11_(&local_270,&this->m_PrtTyp);
  std::operator<<(poVar1,(string *)&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IsPartOf_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Transfer Control Request PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << m_RelRec.GetAsString()
       << "Location Of Part: " << m_LocPrt.GetAsString()
       << m_NmLocID.GetAsString()
       << "Part Type: " << m_PrtTyp.GetAsString();

    return ss.str();
}